

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_intarith(ASMState *as,IRIns *ir,x86Arith xa)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  MCode *pMVar6;
  x86Arith xVar7;
  Reg dest;
  int iVar8;
  uint uVar9;
  Reg rb;
  uint uVar10;
  byte bVar11;
  uint uVar12;
  x86Op xVar13;
  bool bVar14;
  IRRef local_3c;
  int32_t k;
  x86Arith local_34;
  
  uVar1 = (ir->field_0).op1;
  local_3c = (IRRef)uVar1;
  uVar2 = (ir->field_0).op2;
  k = 0;
  pbVar5 = as->mcp;
  if (as->flagmcp == pbVar5) {
    bVar14 = *pbVar5 < 0x84;
    bVar11 = pbVar5[(ulong)bVar14 + 3] & 0xf;
    if (bVar11 < 0xe) {
      if (0xb < bVar11) {
        pbVar5[(ulong)bVar14 + 3] = pbVar5[(ulong)bVar14 + 3] - 4;
      }
      as->flagmcp = (MCode *)0x0;
      as->mcp = pbVar5 + (ulong)bVar14 + 2;
    }
  }
  bVar11 = *(byte *)((long)as->ir + (ulong)uVar2 * 8 + 6);
  uVar10 = (uint)bVar11;
  if ((char)bVar11 < '\0') {
    uVar12 = 0xffef;
  }
  else {
    uVar12 = ~(1 << (uVar10 & 0x1f)) & 0xffef;
    as->weakset = as->weakset & (-2 << (bVar11 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar11 & 0x1f));
  }
  local_34 = xa;
  dest = ra_dest(as,ir,uVar12);
  uVar9 = dest;
  if (((uVar1 != uVar2) && (uVar9 = uVar10, (char)bVar11 < '\0')) &&
     (iVar8 = asm_isk32(as,(uint)uVar2,&k), iVar8 == 0)) {
    iVar8 = asm_swapops(as,ir);
    uVar10 = (uint)uVar2;
    if (iVar8 == 0) {
      uVar10 = local_3c;
      local_3c = (uint)uVar2;
    }
    uVar9._0_2_ = *(IROpT *)((long)ir + 4);
    uVar9._2_2_ = *(IRRef1 *)((long)ir + 6);
    uVar9 = asm_fuseloadm(as,local_3c,uVar12 & ~(1 << (dest & 0x1f)),
                          (uint)((0x604208U >> (uVar9 & 0x1f) & 1) != 0));
    local_3c = uVar10;
  }
  xVar7 = local_34;
  if ((char)(ir->field_1).t.irt < '\0') {
    asm_guardcc(as,0);
  }
  if (xVar7 == XOg_X_IMUL) {
    uVar3._0_2_ = *(IROpT *)((long)ir + 4);
    uVar3._2_2_ = *(IRRef1 *)((long)ir + 6);
    uVar12 = (uint)((0x604208U >> (uVar3 & 0x1f) & 1) != 0);
    if (0x7f < uVar9) {
      rb = asm_fuseloadm(as,local_3c,0xffef,uVar12);
      if ((char)(MCode)k == k) {
        pMVar6 = as->mcp;
        as->mcp = pMVar6 + -1;
        pMVar6[-1] = (MCode)k;
        xVar13 = XO_IMULi8;
      }
      else {
        pMVar6 = as->mcp;
        *(int32_t *)(pMVar6 + -4) = k;
        as->mcp = pMVar6 + -4;
        xVar13 = XO_IMULi;
      }
      uVar4._0_2_ = *(IROpT *)((long)ir + 4);
      uVar4._2_2_ = *(IRRef1 *)((long)ir + 6);
      emit_mrm(as,xVar13,-(uint)((0x604208U >> (uVar4 & 0x1f) & 1) != 0) & 0x80200 | dest,rb);
      return;
    }
    uVar10 = 0x80200;
    if (uVar12 == 0) {
      uVar10 = 0;
    }
    xVar13 = XO_IMUL;
  }
  else {
    if (0x7f < uVar9) {
      uVar10._0_2_ = *(IROpT *)((long)ir + 4);
      uVar10._2_2_ = *(IRRef1 *)((long)ir + 6);
      emit_gri(as,xVar7 + 0x838100,-(uint)((0x604208U >> (uVar10 & 0x1f) & 1) != 0) & 0x80200 | dest
               ,k);
      goto LAB_00137f3e;
    }
    xVar13 = xVar7 << 0x1b | 0x30000fe;
    uVar12._0_2_ = *(IROpT *)((long)ir + 4);
    uVar12._2_2_ = *(IRRef1 *)((long)ir + 6);
    uVar10 = -(uint)((0x604208U >> (uVar12 & 0x1f) & 1) != 0) & 0x80200;
  }
  emit_mrm(as,xVar13,uVar10 | dest,uVar9);
LAB_00137f3e:
  ra_left(as,dest,local_3c);
  return;
}

Assistant:

static void asm_intarith(ASMState *as, IRIns *ir, x86Arith xa)
{
  IRRef lref = ir->op1;
  IRRef rref = ir->op2;
  RegSet allow = RSET_GPR;
  Reg dest, right;
  int32_t k = 0;
  if (as->flagmcp == as->mcp) {  /* Drop test r,r instruction. */
    MCode *p = as->mcp + ((LJ_64 && *as->mcp < XI_TESTb) ? 3 : 2);
    if ((p[1] & 15) < 14) {
      if ((p[1] & 15) >= 12) p[1] -= 4;  /* L <->S, NL <-> NS */
      as->flagmcp = NULL;
      as->mcp = p;
    }  /* else: cannot transform LE/NLE to cc without use of OF. */
  }
  right = IR(rref)->r;
  if (ra_hasreg(right)) {
    rset_clear(allow, right);
    ra_noweak(as, right);
  }
  dest = ra_dest(as, ir, allow);
  if (lref == rref) {
    right = dest;
  } else if (ra_noreg(right) && !asm_isk32(as, rref, &k)) {
    if (asm_swapops(as, ir)) {
      IRRef tmp = lref; lref = rref; rref = tmp;
    }
    right = asm_fuseloadm(as, rref, rset_clear(allow, dest), irt_is64(ir->t));
  }
  if (irt_isguard(ir->t))  /* For IR_ADDOV etc. */
    asm_guardcc(as, CC_O);
  if (xa != XOg_X_IMUL) {
    if (ra_hasreg(right))
      emit_mrm(as, XO_ARITH(xa), REX_64IR(ir, dest), right);
    else
      emit_gri(as, XG_ARITHi(xa), REX_64IR(ir, dest), k);
  } else if (ra_hasreg(right)) {  /* IMUL r, mrm. */
    emit_mrm(as, XO_IMUL, REX_64IR(ir, dest), right);
  } else {  /* IMUL r, r, k. */
    /* NYI: use lea/shl/add/sub (FOLD only does 2^k) depending on CPU. */
    Reg left = asm_fuseloadm(as, lref, RSET_GPR, irt_is64(ir->t));
    x86Op xo;
    if (checki8(k)) { emit_i8(as, k); xo = XO_IMULi8;
    } else { emit_i32(as, k); xo = XO_IMULi; }
    emit_mrm(as, xo, REX_64IR(ir, dest), left);
    return;
  }
  ra_left(as, dest, lref);
}